

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void insert_flipped_container
               (roaring_array_t *ans_arr,roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,
               uint16_t lb_end)

{
  ushort uVar1;
  run_container_t *c;
  _Bool _Var2;
  uint uVar3;
  array_container_t *paVar4;
  int iVar5;
  run_container_t *run;
  uint8_t uVar6;
  uint8_t type;
  uint uVar7;
  uint uVar8;
  run_container_t *local_30;
  
  iVar5 = x1_arr->size;
  if (((long)iVar5 == 0) || (x1_arr->keys[(long)iVar5 + -1] == hb)) {
    uVar3 = iVar5 - 1;
  }
  else if (iVar5 < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    iVar5 = iVar5 + -1;
    uVar7 = 0;
    do {
      uVar3 = iVar5 + uVar7 >> 1;
      uVar1 = *(ushort *)((long)x1_arr->keys + (ulong)(iVar5 + uVar7 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar7 = uVar3 + 1;
      }
      else {
        if (uVar1 <= hb) goto LAB_001087c2;
        iVar5 = uVar3 - 1;
      }
    } while ((int)uVar7 <= iVar5);
    uVar3 = ~uVar7;
  }
LAB_001087c2:
  iVar5 = ans_arr->size;
  if (((long)iVar5 == 0) || (ans_arr->keys[(long)iVar5 + -1] == hb)) {
    uVar7 = iVar5 - 1;
  }
  else if (iVar5 < 1) {
    uVar7 = 0xffffffff;
  }
  else {
    iVar5 = iVar5 + -1;
    uVar8 = 0;
    do {
      uVar7 = iVar5 + uVar8 >> 1;
      uVar1 = *(ushort *)((long)ans_arr->keys + (ulong)(iVar5 + uVar8 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar8 = uVar7 + 1;
      }
      else {
        if (uVar1 <= hb) goto LAB_001087dd;
        iVar5 = uVar7 - 1;
      }
    } while ((int)uVar8 <= iVar5);
    uVar7 = ~uVar8;
  }
LAB_001087dd:
  if (-1 < (int)uVar3) {
    uVar6 = x1_arr->typecodes[uVar3 & 0xffff];
    paVar4 = (array_container_t *)x1_arr->containers[uVar3 & 0xffff];
    if (uVar6 == '\x04') {
      uVar6 = *(uint8_t *)&paVar4->array;
      paVar4 = *(array_container_t **)paVar4;
    }
    uVar3 = (uint)lb_start;
    iVar5 = lb_end + 1;
    local_30 = (run_container_t *)0x0;
    if (uVar6 == '\x03') {
      iVar5 = run_container_negation_range((run_container_t *)paVar4,uVar3,iVar5,&local_30);
      uVar6 = (uint8_t)iVar5;
      run = local_30;
      type = uVar6;
      if (uVar6 == '\x04') {
        uVar6 = *(uint8_t *)&local_30->runs;
        run = *(run_container_t **)local_30;
        type = '\x04';
      }
    }
    else {
      if (uVar6 == '\x02') {
        _Var2 = array_container_negation_range(paVar4,uVar3,iVar5,&local_30);
      }
      else {
        _Var2 = bitset_container_negation_range((bitset_container_t *)paVar4,uVar3,iVar5,&local_30);
      }
      uVar6 = '\x02' - _Var2;
      run = local_30;
      type = uVar6;
    }
    c = local_30;
    if (uVar6 == '\x03') {
      iVar5 = run_container_cardinality(run);
    }
    else {
      iVar5 = run->n_runs;
    }
    if (iVar5 == 0) {
      container_free(c,type);
    }
    else {
      ra_insert_new_key_value_at(ans_arr,~uVar7,hb,c,type);
    }
    return;
  }
  uVar3 = (uint)lb_start;
  iVar5 = lb_end - uVar3;
  if (iVar5 + 2U < 3) {
    paVar4 = array_container_create_range(uVar3,lb_end + 1);
    uVar6 = '\x02';
  }
  else {
    paVar4 = (array_container_t *)run_container_create_given_capacity(1);
    uVar6 = '\x03';
    if (paVar4 == (array_container_t *)0x0) {
      paVar4 = (array_container_t *)0x0;
    }
    else {
      *(uint *)(paVar4->array + (long)paVar4->cardinality * 2) = iVar5 * 0x10000 | uVar3;
      paVar4->cardinality = paVar4->cardinality + 1;
    }
  }
  ra_insert_new_key_value_at(ans_arr,~uVar7,hb,paVar4,uVar6);
  return;
}

Assistant:

static void insert_flipped_container(roaring_array_t *ans_arr,
                                     const roaring_array_t *x1_arr, uint16_t hb,
                                     uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    const int j = ra_get_index(ans_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container =
            container_not_range(container_to_flip, ctype_in, (uint32_t)lb_start,
                                (uint32_t)(lb_end + 1), &ctype_out);

        if (container_get_cardinality(flipped_container, ctype_out))
            ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                       ctype_out);
        else {
            container_free(flipped_container, ctype_out);
        }
    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                   ctype_out);
    }
}